

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_internal.c
# Opt level: O0

int http_send_error2(size_t error,intptr_t uuid,http_settings_s *settings)

{
  http_fio_protocol_s *owner;
  http_s *h;
  http_vtable_s *vtbl;
  int ret;
  http_s *r;
  fio_protocol_s *pr;
  http_settings_s *settings_local;
  intptr_t uuid_local;
  size_t error_local;
  
  if (((uuid == 0) || (settings == (http_settings_s *)0x0)) || (error == 0)) {
    error_local._4_4_ = -1;
  }
  else {
    owner = (http_fio_protocol_s *)http1_new(uuid,settings,(void *)0x0,0);
    h = (http_s *)fio_malloc(0x80);
    if (owner == (http_fio_protocol_s *)0x0) {
      if (0 < FIO_LOG_LEVEL) {
        FIO_LOG2STDERR(
                      "FATAL: (/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/http/http_internal.c:101) Couldn\'t allocate response object for error report."
                      );
      }
      perror("     errno");
      exit(-1);
    }
    vtbl = (http_vtable_s *)http1_vtable();
    http_s_new(h,owner,vtbl);
    error_local._4_4_ = http_send_error(h,error);
    fio_close(uuid);
  }
  return error_local._4_4_;
}

Assistant:

int http_send_error2(size_t error, intptr_t uuid, http_settings_s *settings) {
  if (!uuid || !settings || !error)
    return -1;
  fio_protocol_s *pr = http1_new(uuid, settings, NULL, 0);
  http_s *r = fio_malloc(sizeof(*r));
  FIO_ASSERT(pr, "Couldn't allocate response object for error report.")
  http_s_new(r, (http_fio_protocol_s *)pr, http1_vtable());
  int ret = http_send_error(r, error);
  fio_close(uuid);
  return ret;
}